

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O3

void LEARNER::multiline_learn_or_predict<false>
               (multi_learner *base,multi_ex *examples,uint64_t offset,uint32_t id)

{
  int iVar1;
  pointer ppeVar2;
  pointer ppeVar3;
  ulong uVar4;
  multi_ex *__range2;
  multi_learner *pmVar5;
  uint64_t *puVar6;
  multi_learner *pmVar7;
  uint32_t uVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> saved_offsets;
  allocator_type local_55;
  uint32_t local_54;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  multi_learner *local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_50,
             (long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_55);
  ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar8 = id;
  pmVar5 = base;
  if (ppeVar3 == ppeVar2) {
    pmVar5 = base + 0xe0;
    pmVar7 = base;
    uVar8 = id;
  }
  else {
    do {
      local_38 = pmVar5;
      local_54 = uVar8;
      puVar6 = &((*ppeVar3)->super_example_predict).ft_offset;
      if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_50,
                   (iterator)
                   local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,puVar6);
      }
      else {
        *local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = *puVar6;
        local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      *puVar6 = offset;
      ppeVar3 = ppeVar3 + 1;
      uVar8 = local_54;
      pmVar5 = local_38;
    } while (ppeVar3 != ppeVar2);
    ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    pmVar5 = local_38 + 0xe0;
    pmVar7 = local_38;
    if (ppeVar3 != ppeVar2) {
      iVar1 = *(int *)pmVar5;
      do {
        puVar6 = &((*ppeVar3)->super_example_predict).ft_offset;
        *puVar6 = *puVar6 + (ulong)(iVar1 * local_54);
        ppeVar3 = ppeVar3 + 1;
      } while (ppeVar3 != ppeVar2);
    }
  }
  (**(code **)(pmVar7 + 0x30))
            (*(undefined8 *)(pmVar7 + 0x18),*(undefined8 *)(pmVar7 + 0x20),examples);
  ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar3 != ppeVar2) {
    iVar1 = *(int *)pmVar5;
    do {
      puVar6 = &((*ppeVar3)->super_example_predict).ft_offset;
      *puVar6 = *puVar6 - (ulong)(uVar8 * iVar1);
      ppeVar3 = ppeVar3 + 1;
    } while (ppeVar3 != ppeVar2);
    ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
        super__Vector_impl_data._M_finish != ppeVar3) {
      uVar4 = 0;
      do {
        (ppeVar3[uVar4]->super_example_predict).ft_offset =
             local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4];
        uVar4 = uVar4 + 1;
        ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar4 < (ulong)((long)(examples->
                                     super__Vector_base<example_*,_std::allocator<example_*>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3)
              );
      goto LAB_001caba0;
    }
  }
  if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return;
  }
LAB_001caba0:
  operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start);
  return;
}

Assistant:

void multiline_learn_or_predict(multi_learner& base, multi_ex& examples, const uint64_t offset, const uint32_t id = 0)
{
  std::vector<uint64_t> saved_offsets(examples.size());
  for (auto ec : examples)
  {
    saved_offsets.push_back(ec->ft_offset);
    ec->ft_offset = offset;
  }

  if (is_learn)
    base.learn(examples, id);
  else
    base.predict(examples, id);

  for (size_t i = 0; i < examples.size(); i++) examples[i]->ft_offset = saved_offsets[i];
}